

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

int __thiscall
btAlignedObjectArray<btSoftBody::Node_*>::findLinearSearch
          (btAlignedObjectArray<btSoftBody::Node_*> *this,Node **key)

{
  int iVar1;
  int iVar2;
  long *in_RSI;
  btAlignedObjectArray<btSoftBody::Node_*> *in_RDI;
  int i;
  int index;
  int local_18;
  
  iVar1 = size(in_RDI);
  local_18 = 0;
  while( true ) {
    iVar2 = size(in_RDI);
    if (iVar2 <= local_18) {
      return iVar1;
    }
    if (in_RDI->m_data[local_18] == (Node *)*in_RSI) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

int	findLinearSearch(const T& key) const
	{
		int index=size();
		int i;

		for (i=0;i<size();i++)
		{
			if (m_data[i] == key)
			{
				index = i;
				break;
			}
		}
		return index;
	}